

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

int numistrueint(lua_Number n,int32_t *kp)

{
  int iVar1;
  int iStack_2c;
  TValue tv;
  int32_t k;
  int32_t *kp_local;
  lua_Number n_local;
  
  iVar1 = (int)n;
  if ((n != (double)iVar1) || (NAN(n) || NAN((double)iVar1))) {
    n_local._4_4_ = 0;
  }
  else {
    if (kp != (int32_t *)0x0) {
      *kp = iVar1;
    }
    if ((iVar1 == 0) && (iStack_2c = (int)((ulong)n >> 0x20), iStack_2c != 0)) {
      n_local._4_4_ = 0;
    }
    else {
      n_local._4_4_ = 1;
    }
  }
  return n_local._4_4_;
}

Assistant:

static int numistrueint(lua_Number n, int32_t *kp)
{
  int32_t k = lj_num2int(n);
  if (n == (lua_Number)k) {
    if (kp) *kp = k;
    if (k == 0) {  /* Special check for -0. */
      TValue tv;
      setnumV(&tv, n);
      if (tv.u32.hi != 0)
	return 0;
    }
    return 1;
  }
  return 0;
}